

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dlog.cpp
# Opt level: O0

long measure<main::__0>(anon_class_8_1_5fbbe6ce fun)

{
  rep rVar1;
  duration<long,_std::ratio<1L,_1000000000L>_> local_38;
  duration<long,_std::ratio<1L,_1000000000L>_> local_30 [2];
  rep duration;
  time_point end;
  time_point begin;
  anon_class_8_1_5fbbe6ce fun_local;
  
  begin.__d.__r = (duration)(duration)fun.logger;
  end.__d.__r = (duration)std::chrono::_V2::system_clock::now();
  main::anon_class_8_1_5fbbe6ce::operator()((anon_class_8_1_5fbbe6ce *)&begin);
  duration = std::chrono::_V2::system_clock::now();
  local_38.__r = (rep)std::chrono::operator-
                                ((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                  *)&duration,&end);
  local_30[0].__r =
       (rep)std::chrono::
            duration_cast<std::chrono::duration<long,std::ratio<1l,1000000000l>>,long,std::ratio<1l,1000000000l>>
                      (&local_38);
  rVar1 = std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>::count(local_30);
  return rVar1;
}

Assistant:

long measure(Fun fun) {
  auto begin = sc::high_resolution_clock::now();

  fun();

  auto end = sc::high_resolution_clock::now();
  auto duration =
      std::chrono::duration_cast<std::chrono::nanoseconds>(end - begin).count();

  return duration;
}